

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  BombedMazeGame myBombedGame;
  MazeGame myGame;
  BombedMazeGame local_20 [8];
  undefined **local_18;
  
  local_18 = &PTR_MakeMaze_00103d68;
  MazeGame::CreateMaze();
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  BombedMazeGame::BombedMazeGame(local_20);
  MazeGame::CreateMaze();
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    MazeGame myGame;
    Maze* m1 = myGame.CreateMaze();
    std::cout << m1 << std::endl;

    BombedMazeGame myBombedGame;
    Maze* m2 = myBombedGame.CreateMaze();
    std::cout << m2 << std::endl;
}